

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O0

MPP_RET allocator_ion_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  uint __fd;
  uint uVar1;
  size_t *psVar2;
  char *local_40;
  char *heap_name;
  int detect_result;
  allocator_ctx_ion *p;
  RK_S32 fd;
  MppAllocFlagType flags_local;
  size_t alignment_local;
  void **ctx_local;
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_open Android do not accept NULL input\n",(char *)0x0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (void *)0x0;
    __fd = open64(dev_ion,0x80002);
    if ((int)__fd < 0) {
      _mpp_log_l(2,"mpp_ion","open %s failed!\n",(char *)0x0,dev_ion);
      ctx_local._4_4_ = MPP_ERR_UNKNOW;
    }
    else {
      if ((ion_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_ion","open ion dev fd %d\n",(char *)0x0,(ulong)__fd);
      }
      psVar2 = (size_t *)mpp_osal_malloc("allocator_ion_open",0x10);
      if (psVar2 == (size_t *)0x0) {
        close(__fd);
        _mpp_log_l(2,"mpp_ion","os_allocator_open Android failed to allocate context\n",(char *)0x0)
        ;
        ctx_local._4_4_ = MPP_ERR_MALLOC;
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)&lock);
        if (ion_heap_id < 0) {
          uVar1 = check_sysfs_iommu();
          if (uVar1 == 0) {
            ion_heap_mask = 0x10;
            ion_heap_id = 4;
            local_40 = "ION_HEAP_TYPE_DMA";
          }
          else if (uVar1 == 1) {
            ion_heap_mask = 1;
            ion_heap_id = 0;
            local_40 = "ION_HEAP_TYPE_SYSTEM";
          }
          else if (uVar1 == 2) {
            ion_heap_mask = 4;
            ion_heap_id = 2;
            local_40 = "ION_HEAP_TYPE_CARVEOUT";
          }
          else {
            _mpp_log_l(2,"mpp_ion","invalid detect result %d\n",(char *)0x0,(ulong)uVar1);
            ion_heap_mask = 0x10;
            ion_heap_id = 4;
            local_40 = "ION_HEAP_TYPE_DMA";
          }
          _mpp_log_l(4,"mpp_ion","using ion heap %s\n",(char *)0x0,local_40);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&lock);
        *psVar2 = alignment;
        *(MppAllocFlagType *)((long)psVar2 + 0xc) = flags;
        *(uint *)(psVar2 + 1) = __fd;
        *ctx = psVar2;
        ctx_local._4_4_ = MPP_OK;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET allocator_ion_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    RK_S32 fd;
    allocator_ctx_ion *p;

    if (NULL == ctx) {
        mpp_err("os_allocator_open Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    fd = open(dev_ion, O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open %s failed!\n", dev_ion);
        return MPP_ERR_UNKNOW;
    }

    ion_dbg(ION_DEVICE, "open ion dev fd %d\n", fd);

    p = mpp_malloc(allocator_ctx_ion, 1);
    if (NULL == p) {
        close(fd);
        mpp_err("os_allocator_open Android failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        /*
         * do heap id detection here:
         * if there is no vpu_service use default ION_HEAP_TYPE_SYSTEM_CONTIG
         * if there is vpu_service then check the iommu_enable status
         */
        pthread_mutex_lock(&lock);
        if (ion_heap_id < 0) {
            int detect_result = check_sysfs_iommu();
            const char *heap_name = NULL;

            switch (detect_result) {
            case ION_DETECT_IOMMU_DISABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            case ION_DETECT_IOMMU_ENABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_SYSTEM);
                ion_heap_id     = ION_HEAP_TYPE_SYSTEM;
                heap_name = "ION_HEAP_TYPE_SYSTEM";
            } break;
            case ION_DETECT_NO_DTS : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_CARVEOUT);
                ion_heap_id     = ION_HEAP_TYPE_CARVEOUT;
                heap_name = "ION_HEAP_TYPE_CARVEOUT";
            } break;
            default : {
                mpp_err("invalid detect result %d\n", detect_result);
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            }
            mpp_log("using ion heap %s\n", heap_name);
        }
        pthread_mutex_unlock(&lock);
        p->alignment    = alignment;
        p->flags        = flags;
        p->ion_device   = fd;
        *ctx = p;
    }

    return MPP_OK;
}